

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall
icu_63::UVector::UVector
          (UVector *this,UObjectDeleter *d,UElementsAreEqual *c,int32_t initialCapacity,
          UErrorCode *status)

{
  UErrorCode *status_local;
  int32_t initialCapacity_local;
  UElementsAreEqual *c_local;
  UObjectDeleter *d_local;
  UVector *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector_004aa770;
  this->count = 0;
  this->capacity = 0;
  this->elements = (UElement *)0x0;
  this->deleter = d;
  this->comparer = c;
  _init(this,initialCapacity,status);
  return;
}

Assistant:

UVector::UVector(UObjectDeleter *d, UElementsAreEqual *c, int32_t initialCapacity, UErrorCode &status) :
    count(0),
    capacity(0),
    elements(0),
    deleter(d),
    comparer(c)
{
    _init(initialCapacity, status);
}